

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_compact_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  long lVar1;
  REF_STATUS RVar2;
  uint uVar3;
  void *pvVar4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT offset;
  REF_INT *counts;
  int local_e0;
  REF_INT proc;
  REF_INT ncell;
  REF_INT nnode;
  REF_INT nodes [27];
  int local_60;
  int local_5c;
  REF_INT part;
  REF_INT cell_node;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB **l2c_local;
  REF_LONG *ncell_global_local;
  REF_GLOB *nnode_global_local;
  REF_CELL pRStack_20;
  REF_INT cell_id_local;
  REF_CELL ref_cell_local;
  REF_GRID ref_grid_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  _node = ref_grid->mpi;
  ref_node = (REF_NODE)l2c;
  l2c_local = (REF_GLOB **)ncell_global;
  ncell_global_local = nnode_global;
  nnode_global_local._4_4_ = cell_id;
  pRStack_20 = ref_cell;
  ref_cell_local = (REF_CELL)ref_grid;
  if (((REF_NODE)ref_mpi)->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
           "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pvVar4 = malloc((long)((REF_NODE)ref_mpi)->max << 3);
    *(void **)ref_node = pvVar4;
    lVar1._0_4_ = ref_node->n;
    lVar1._4_4_ = ref_node->max;
    if (lVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
             "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_mpi->id;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined8 *)(*(long *)ref_node + (long)ref_private_macro_code_rss_1 * 8) =
             0xffffffffffffffff;
      }
      *ncell_global_local = 0;
      *l2c_local = (REF_GLOB *)0x0;
      proc = 0;
      local_e0 = 0;
      for (cell_node = 0; cell_node < pRStack_20->max; cell_node = cell_node + 1) {
        RVar2 = ref_cell_nodes(pRStack_20,cell_node,&ncell);
        if ((RVar2 == 0) && (nnode_global_local._4_4_ == (&ncell)[pRStack_20->node_per])) {
          uVar3 = ref_cell_part(pRStack_20,(REF_NODE)ref_mpi,cell_node,&local_60);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x22c,"ref_grid_compact_cell_id_nodes",(ulong)uVar3,"part");
            return uVar3;
          }
          if (_node->id == local_60) {
            local_e0 = local_e0 + 1;
          }
          for (local_5c = 0; local_5c < pRStack_20->node_per; local_5c = local_5c + 1) {
            if ((*(int *)((long)ref_mpi[1].start_time + 4) ==
                 *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)(&ncell)[local_5c] * 4)) &&
               (*(long *)(*(long *)ref_node + (long)(&ncell)[local_5c] * 8) == -1)) {
              *(long *)(*(long *)ref_node + (long)(&ncell)[local_5c] * 8) = (long)proc;
              proc = proc + 1;
            }
          }
        }
      }
      *l2c_local = (REF_GLOB *)(long)local_e0;
      uVar3 = ref_mpi_allsum(_node,l2c_local,1,2);
      if (uVar3 == 0) {
        if (_node->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          pvVar4 = malloc((long)_node->n << 2);
          if (pvVar4 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            uVar3 = ref_mpi_allgather(_node,&proc,pvVar4,1);
            if (uVar3 == 0) {
              ref_private_macro_code_rss = 0;
              for (counts._4_4_ = 0; counts._4_4_ < _node->id; counts._4_4_ = counts._4_4_ + 1) {
                ref_private_macro_code_rss =
                     *(int *)((long)pvVar4 + (long)counts._4_4_ * 4) + ref_private_macro_code_rss;
              }
              for (counts._4_4_ = 0; counts._4_4_ < _node->n; counts._4_4_ = counts._4_4_ + 1) {
                *ncell_global_local =
                     (long)*(int *)((long)pvVar4 + (long)counts._4_4_ * 4) + *ncell_global_local;
              }
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
              for (part = 0; part < ref_mpi->id; part = part + 1) {
                if (*(long *)(*(long *)ref_node + (long)part * 8) != -1) {
                  *(long *)(*(long *)ref_node + (long)part * 8) =
                       (long)ref_private_macro_code_rss +
                       *(long *)(*(long *)ref_node + (long)part * 8);
                }
              }
              ref_grid_local._4_4_ = ref_node_ghost_glob((REF_NODE)ref_mpi,*(REF_GLOB **)ref_node,1)
              ;
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x24c,"ref_grid_compact_cell_id_nodes",(ulong)ref_grid_local._4_4_,"xfer");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x23e,"ref_grid_compact_cell_id_nodes",(ulong)uVar3,"gather size");
              ref_grid_local._4_4_ = uVar3;
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x23b,"ref_grid_compact_cell_id_nodes",(ulong)uVar3,"allsum");
        ref_grid_local._4_4_ = uVar3;
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_id_nodes(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_INT cell_id,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        ncell++;
      }
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (ref_node_owned(ref_node, nodes[cell_node]) &&
            (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
          (*l2c)[nodes[cell_node]] = nnode;
          nnode++;
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }